

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

bool Catch::compareEqual<frozen::basic_string<wchar_t>,frozen::basic_string<wchar_t>>
               (basic_string<wchar_t> *lhs,basic_string<wchar_t> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = lhs->size_;
  if (uVar1 != rhs->size_) {
    return false;
  }
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    if (*lhs->data_ != *rhs->data_) {
      return false;
    }
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (uVar1 == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (lhs->data_[uVar3] == rhs->data_[uVar3]);
    bVar4 = uVar1 <= uVar3;
  }
  return bVar4;
}

Assistant:

constexpr bool operator==(basic_string other) const {
    if (size_ != other.size_)
      return false;
    for (std::size_t i = 0; i < size_; ++i)
      if (data_[i] != other.data_[i])
        return false;
    return true;
  }